

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcMapping.c
# Opt level: O0

sparc_hint Sparc_map_hint(char *name)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t l2;
  size_t l1;
  size_t i;
  char *name_local;
  
  sVar2 = strlen(name);
  l1 = 0;
  while( true ) {
    if (2 < l1) {
      return SPARC_HINT_INVALID;
    }
    sVar3 = strlen(hint_maps[l1].name);
    if ((sVar3 < sVar2) && (iVar1 = strcmp(hint_maps[l1].name,name + (sVar2 - sVar3)), iVar1 == 0))
    break;
    l1 = l1 + 1;
  }
  return hint_maps[l1].id;
}

Assistant:

sparc_hint Sparc_map_hint(const char *name)
{
	size_t i, l1, l2;

	l1 = strlen(name);
	for(i = 0; i < ARR_SIZE(hint_maps); i++) {
		l2 = strlen(hint_maps[i].name);
		if (l1 > l2) {
			// compare the last part of @name with this hint string
			if (!strcmp(hint_maps[i].name, name + (l1 - l2)))
				return hint_maps[i].id;
		}
	}

	return SPARC_HINT_INVALID;
}